

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

void data_sheet_expat_callback_find_cell_end(void *callbackdata,XML_Char *name)

{
  uint uVar1;
  int iVar2;
  XML_Char *in_RAX;
  size_t index;
  XML_Char *__s;
  char *pcVar3;
  code *pcVar4;
  long lVar5;
  ulong uVar6;
  size_t col;
  ulong uVar7;
  XML_Char *p;
  
  p = in_RAX;
  iVar2 = XML_Char_icmp_ins(name,"c");
  if (iVar2 != 0) {
    data_sheet_expat_callback_find_row_end(callbackdata,name);
    return;
  }
  if (*(long *)((long)callbackdata + 0x30) != 0) {
    *(undefined1 *)(*(long *)((long)callbackdata + 0x30) + *(long *)((long)callbackdata + 0x38)) = 0
    ;
    if (*(int *)((long)callbackdata + 0x40) == 0) {
      free(*(void **)((long)callbackdata + 0x30));
      *(undefined8 *)((long)callbackdata + 0x30) = 0;
    }
    else if (*(int *)((long)callbackdata + 0x40) == 3) {
      p = (XML_Char *)0x0;
      index = strtol(*(char **)((long)callbackdata + 0x30),&p,10);
      if ((p == (XML_Char *)0x0) ||
         ((p != *(XML_Char **)((long)callbackdata + 0x30) && (*p == '\0')))) {
        __s = sharedstringlist_get(*(sharedstringlist **)((long)callbackdata + 8),index);
        free(*(void **)((long)callbackdata + 0x30));
        if (__s == (XML_Char *)0x0) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = strdup(__s);
        }
        *(char **)((long)callbackdata + 0x30) = pcVar3;
      }
    }
  }
  *(long *)((long)callbackdata + 0x18) = *(long *)((long)callbackdata + 0x18) + 1;
  *(undefined4 *)((long)callbackdata + 0x40) = 0;
  *(undefined8 *)((long)callbackdata + 0x38) = 0;
  XML_SetElementHandler
            (*callbackdata,data_sheet_expat_callback_find_cell_start,
             data_sheet_expat_callback_find_row_end);
  XML_SetCharacterDataHandler(*callbackdata,0);
  lVar5 = *(long *)((long)callbackdata + 0x30);
  uVar1 = *(uint *)((long)callbackdata + 0x44);
  if (((lVar5 != 0) ||
      (((uVar1 & 2) == 0 && (((uVar1 & 1) == 0 || (*(long *)((long)callbackdata + 0x28) != 0))))))
     && (((uVar1 & 4) == 0 ||
         ((*(ulong *)((long)callbackdata + 0x20) == 0 ||
          (*(ulong *)((long)callbackdata + 0x18) <= *(ulong *)((long)callbackdata + 0x20))))))) {
    if ((char)uVar1 < '\0') {
      if (lVar5 == 0) {
        pcVar3 = strdup("");
        *(char **)((long)callbackdata + 0x30) = pcVar3;
      }
      XML_StopParser(*callbackdata,1);
    }
    else {
      pcVar4 = *(code **)((long)callbackdata + 0x78);
      if (pcVar4 == (code *)0x0) {
        return;
      }
      if ((uVar1 & 2) == 0) {
        uVar6 = *(ulong *)((long)callbackdata + 0x18);
        if (1 < uVar6 && *(long *)((long)callbackdata + 0x28) == 0) {
          uVar7 = 1;
          do {
            uVar6 = *(ulong *)((long)callbackdata + 0x18);
            pcVar4 = *(code **)((long)callbackdata + 0x78);
            if (uVar6 <= uVar7) {
              lVar5 = *(long *)((long)callbackdata + 0x30);
              goto LAB_00104ad8;
            }
            iVar2 = (*pcVar4)(*(undefined8 *)((long)callbackdata + 0x10),uVar7,0,
                              *(undefined8 *)((long)callbackdata + 0x80));
            uVar7 = uVar7 + 1;
          } while (iVar2 == 0);
          goto LAB_00104ae9;
        }
      }
      else {
        uVar6 = *(ulong *)((long)callbackdata + 0x18);
      }
LAB_00104ad8:
      iVar2 = (*pcVar4)(*(undefined8 *)((long)callbackdata + 0x10),uVar6,lVar5,
                        *(undefined8 *)((long)callbackdata + 0x80));
      if (iVar2 != 0) {
LAB_00104ae9:
        XML_StopParser(*callbackdata,0);
        return;
      }
    }
    *(long *)((long)callbackdata + 0x28) = *(long *)((long)callbackdata + 0x28) + 1;
  }
  return;
}

Assistant:

void data_sheet_expat_callback_find_cell_end (void* callbackdata, const XML_Char* name)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("c")) == 0) {
    //determine value
    if (data->celldata) {
      data->celldata[data->celldatalen] = 0;
      if (data->cell_string_type == shared_string) {
        //get shared string
        XML_Char* p = NULL;
        long num = XML_Char_strtol(data->celldata, &p, 10);
        if (!p || (p != data->celldata && *p == 0)) {
          const XML_Char* s = sharedstringlist_get(data->sharedstrings, num);
          free(data->celldata);
          data->celldata = (s ? XML_Char_dup(s) : NULL);
        }
      } else if (data->cell_string_type == none) {
        //unknown value type
        free(data->celldata);
        data->celldata = NULL;
      }
    }
    //reset data
    data->colnr++;
    data->cell_string_type = none;
    data->celldatalen = 0;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_cell_start, data_sheet_expat_callback_find_row_end);
    XML_SetCharacterDataHandler(data->xmlparser, NULL);
    //process data if needed
    if (data->celldata || !((data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) || ((data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && data->colsnotnull == 0))) {
      if (!((data->flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && data->cols > 0 && data->colnr > data->cols)) {
        //process data
        if (!(data->flags & XLSXIOREAD_NO_CALLBACK)) {
          if (data->sheet_cell_callback) {
            //insert empty columns if needed in case of empty row detection
            /////if ((data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && !(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->colsnotnull == 0 && data->colnr > 1) {
            if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->colsnotnull == 0 && data->colnr > 1) {
              size_t col;
              for (col = 1; col < data->colnr; col++) {
                if ((*data->sheet_cell_callback)(data->rownr, col, NULL, data->callbackdata)) {
                  XML_StopParser(data->xmlparser, XML_FALSE);
                  return;
                }
              }
            }
            //process current column data
            if ((*data->sheet_cell_callback)(data->rownr, data->colnr, data->celldata, data->callbackdata)) {
              XML_StopParser(data->xmlparser, XML_FALSE);
              return;
            }
            data->colsnotnull++;
          }
        } else {
          //for non-calback method suspend here with cell data (don't return NULL as that is used to indicate end of row)
          if (!data->celldata)
            data->celldata = XML_Char_dup(X(""));
          XML_StopParser(data->xmlparser, XML_TRUE);
          data->colsnotnull++;
        }
      }
    }
  } else {
    data_sheet_expat_callback_find_row_end(callbackdata, name);
  }
}